

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.h
# Opt level: O0

Float __thiscall
Gecko::FunctionalRMS::optimum
          (FunctionalRMS *this,
          vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_> *v)

{
  bool bVar1;
  const_iterator this_00;
  pointer pWVar2;
  const_iterator p;
  WeightedSum s;
  Float in_stack_ffffffffffffffc8;
  Float in_stack_ffffffffffffffcc;
  __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
  in_stack_ffffffffffffffd0;
  int iVar3;
  __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
  local_20;
  float local_18;
  float local_14;
  
  WeightedSum::WeightedSum
            ((WeightedSum *)in_stack_ffffffffffffffd0._M_current,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  local_20._M_current =
       (WeightedValue *)
       std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::begin
                 ((vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_> *)
                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  while( true ) {
    this_00 = std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>::end
                        ((vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_> *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                        *)in_stack_ffffffffffffffd0._M_current,
                       (__normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    iVar3 = (int)((ulong)in_stack_ffffffffffffffd0._M_current >> 0x20);
    if (!bVar1) break;
    pWVar2 = __gnu_cxx::
             __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
             ::operator->(&local_20);
    in_stack_ffffffffffffffcc = pWVar2->weight;
    pWVar2 = __gnu_cxx::
             __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
             ::operator->(&local_20);
    local_18 = in_stack_ffffffffffffffcc * pWVar2->value + local_18;
    pWVar2 = __gnu_cxx::
             __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
             ::operator->(&local_20);
    local_14 = pWVar2->weight + local_14;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_Gecko::WeightedValue_*,_std::vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_>_>
         ::operator++(this_00._M_current,iVar3);
  }
  return local_18 / local_14;
}

Assistant:

Float optimum(const std::vector<WeightedValue>& v) const
  {
    // Compute the optimum as the weighted mean.
    WeightedSum s;
    for (std::vector<WeightedValue>::const_iterator p = v.begin(); p != v.end(); p++) {
      s.value += p->weight * p->value;
      s.weight += p->weight;
    }
    return s.value / s.weight;
  }